

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bninchrr(const_bstring b0,int pos,const_bstring b1)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  charField chrs;
  charField local_40;
  
  if ((((b0 != (const_bstring)0x0 && -1 < pos) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (iVar2 = b0->slen, pos <= iVar2)) && (iVar8 = buildCharField(&local_40,b1), -1 < iVar8)) {
    uVar10 = pos - (uint)(iVar2 == pos);
    lVar9 = 0;
    do {
      uVar5 = *(uint *)(local_40.content + lVar9 + 4);
      uVar6 = *(uint *)(local_40.content + lVar9 + 8);
      uVar7 = *(uint *)(local_40.content + lVar9 + 0xc);
      *(uint *)(local_40.content + lVar9) = *(uint *)(local_40.content + lVar9) ^ 0xffffffff;
      *(uint *)(local_40.content + lVar9 + 4) = uVar5 ^ 0xffffffff;
      *(uint *)(local_40.content + lVar9 + 8) = uVar6 ^ 0xffffffff;
      *(uint *)(local_40.content + lVar9 + 0xc) = uVar7 ^ 0xffffffff;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x20);
    if (-1 < (int)uVar10) {
      do {
        bVar1 = puVar3[uVar10];
        if ((local_40.content[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0) {
          return uVar10;
        }
        bVar4 = 0 < (int)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
    }
  }
  return -1;
}

Assistant:

int bninchrr (const_bstring b0, int pos, const_bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrrCF (b0->data, pos, &chrs);
}